

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffghps(fitsfile *fptr,int *nexist,int *position,int *status)

{
  int *in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  int *in_RDI;
  int *in_stack_00000040;
  int *in_stack_00000048;
  int in_stack_00000054;
  fitsfile *in_stack_00000058;
  int local_4;
  
  if (*in_RCX < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_00000058,in_stack_00000054,in_stack_00000048,in_stack_00000040);
    }
    if (in_RSI != (undefined4 *)0x0) {
      *in_RSI = (int)((*(long *)(*(long *)(in_RDI + 2) + 0x70) -
                      *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                               (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) / 0x50);
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = (int)((*(long *)(*(long *)(in_RDI + 2) + 0x80) -
                      *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                               (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) / 0x50) + 1;
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffghps(fitsfile *fptr, /* I - FITS file pointer                     */
          int *nexist,     /* O - number of existing keywords in header */
          int *position,   /* O - position of next keyword to be read   */
          int *status)     /* IO - error status                         */
/*
  return the number of existing keywords and the position of the next
  keyword that will be read.
*/
{
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nexist)
      *nexist = (int) (( ((fptr->Fptr)->headend) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80);

    if (position)
      *position = (int) (( ((fptr->Fptr)->nextkey) - ((fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) ) / 80 + 1);

    return(*status);
}